

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GenTableBuilders
          (PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  string *code;
  size_t local_40;
  difference_type offset;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_28;
  const_iterator it;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PhpGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  GetStartOfTable(struct_def,code_ptr);
  local_28._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_28);
    offset = (difference_type)*ppFVar2;
    if ((((FieldDef *)offset)->deprecated & 1U) == 0) {
      code = (string *)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (&(struct_def->fields).vec);
      local_40 = __gnu_cxx::operator-
                           (&local_28,
                            (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                             *)&code);
      if (*(int *)(offset + 200) == 0x10) {
        local_50 = (string *)it._M_current;
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"public static function add");
        std::__cxx11::string::operator+=(local_50,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        ConvertCase(&local_a0,(string *)offset,kUpperCamel,kSnake);
        std::__cxx11::string::operator+=(local_50,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::operator+=(local_50,"(FlatBufferBuilder $builder, $offset)\n");
        std::operator+(&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::operator+=(local_50,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_);
        std::operator+(&local_e0,&local_100,"$builder->addOffsetX(");
        std::__cxx11::string::operator+=(local_50,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        NumToString<long>(&local_140,local_40);
        std::operator+(&local_120,&local_140,", $offset, 0);\n");
        std::__cxx11::string::operator+=(local_50,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::operator+(&local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::operator+=(local_50,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
      }
      else {
        BuildFieldOfTable((FieldDef *)offset,local_40,(string *)it._M_current);
      }
      bVar1 = IsVector((Type *)(offset + 200));
      if (bVar1) {
        BuildVectorOfTable((FieldDef *)offset,(string *)it._M_current);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_28);
  }
  GetEndOffsetOnTable(this,struct_def,(string *)it._M_current);
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    GetStartOfTable(struct_def, code_ptr);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      auto offset = it - struct_def.fields.vec.begin();
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        std::string &code = *code_ptr;
        code += Indent + "public static function add";
        code += ConvertCase(field.name, Case::kUpperCamel);
        code += "(FlatBufferBuilder $builder, $offset)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "$builder->addOffsetX(";
        code += NumToString(offset) + ", $offset, 0);\n";
        code += Indent + "}\n\n";
      } else {
        BuildFieldOfTable(field, offset, code_ptr);
      }
      if (IsVector(field.value.type)) { BuildVectorOfTable(field, code_ptr); }
    }

    GetEndOffsetOnTable(struct_def, code_ptr);
  }